

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Graph<Node>::addEdge(Graph<Node> *this,Edge *edge)

{
  NodeList<Node> *pNVar1;
  Node local_34;
  Node local_2c;
  int local_24;
  int local_20;
  int cost;
  int dest;
  int source;
  Edge *edge_local;
  Graph<Node> *this_local;
  
  this->_edgeCnt = this->_edgeCnt + 1;
  _dest = edge;
  edge_local = (Edge *)this;
  vector<Edge>::push_back(&this->edges,edge);
  cost = Edge::getSource(_dest);
  local_20 = Edge::getDest(_dest);
  local_24 = Edge::getCost(_dest);
  pNVar1 = vector<NodeList<Node>_>::operator[](&this->G,&cost);
  Node::Node(&local_2c,local_20,local_24);
  NodeList<Node>::push_back(pNVar1,&local_2c);
  pNVar1 = vector<NodeList<Node>_>::operator[](&this->G,&local_20);
  Node::Node(&local_34,cost,local_24);
  NodeList<Node>::push_back(pNVar1,&local_34);
  return;
}

Assistant:

inline void addEdge(const Edge &edge) {
        ++_edgeCnt;
        edges.push_back(edge);

        int source = edge.getSource();
        int dest = edge.getDest();
        int cost = edge.getCost();

//        if (source < size() or dest < size()) {
//            resize(max(source, dest));
//        }

        G[source].push_back(NodeT(dest, cost));
        G[dest].push_back(NodeT(source, cost));
    }